

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

long __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>::latency
          (cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_delay_line<float>_>
           *this)

{
  cubeb_resampler_speex_one_way<float> *this_00;
  uint uVar1;
  
  this_00 = (this->input_processor)._M_t.
            super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
            .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (this_00 == (cubeb_resampler_speex_one_way<float> *)0x0) {
    uVar1 = ((this->output_processor)._M_t.
             super___uniq_ptr_impl<delay_line<float>,_std::default_delete<delay_line<float>_>_>._M_t
             .super__Tuple_impl<0UL,_delay_line<float>_*,_std::default_delete<delay_line<float>_>_>.
             super__Head_base<0UL,_delay_line<float>_*,_false>._M_head_impl)->length;
  }
  else {
    uVar1 = cubeb_resampler_speex_one_way<float>::latency(this_00);
  }
  return (ulong)uVar1;
}

Assistant:

virtual long latency()
  {
    if (input_processor && output_processor) {
      assert(input_processor->latency() == output_processor->latency());
      return input_processor->latency();
    } else if (input_processor) {
      return input_processor->latency();
    } else {
      return output_processor->latency();
    }
  }